

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::MultAdd
          (TPZSkylMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *x
          ,TPZFMatrix<std::complex<long_double>_> *y,TPZFMatrix<std::complex<long_double>_> *z,
          complex<long_double> alpha,complex<long_double> beta,int opt)

{
  undefined8 uVar1;
  complex<long_double> *pcVar2;
  longdouble __r;
  complex<long_double> beta_00;
  TPZBaseMatrix *pTVar3;
  TPZFMatrix<std::complex<long_double>_> *pTVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  ostream *poVar8;
  void *this_00;
  complex<long_double> **ppcVar9;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<std::complex<long_double>_> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  complex<long_double> *zp;
  complex<long_double> *diaglast;
  complex<long_double> *diag;
  complex<long_double> *p;
  complex<long_double> val;
  int64_t offset;
  int r;
  int ic;
  int64_t xcols;
  int64_t rows;
  complex<long_double> *__y;
  undefined2 uVar10;
  undefined6 uVar11;
  complex<long_double> *column;
  undefined2 uVar12;
  int64_t in_stack_fffffffffffffd48;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffd50;
  ostream *in_stack_fffffffffffffd60;
  int opt_00;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffdc0;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffdc8;
  TPZMatrix<std::complex<long_double>_> *this_01;
  undefined1 in_stack_fffffffffffffde8 [24];
  undefined8 local_178 [5];
  complex<long_double> *local_150;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  complex<long_double> *local_98;
  complex<long_double> local_88;
  long local_68;
  int local_60;
  int local_5c;
  long local_58;
  int64_t local_50;
  _func_int **local_48;
  int64_t local_40;
  complex<long_double> *local_38;
  undefined8 local_30;
  int local_24;
  TPZBaseMatrix *local_20;
  TPZBaseMatrix *local_18;
  TPZFMatrix<std::complex<long_double>_> *local_10;
  
  this_01 = (TPZMatrix<std::complex<long_double>_> *)&stack0x00000028;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_R8D == 0) {
    in_stack_fffffffffffffdc8 =
         (TPZFMatrix<std::complex<long_double>_> *)TPZBaseMatrix::Cols(in_RDI);
    pTVar4 = (TPZFMatrix<std::complex<long_double>_> *)
             TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
    if (in_stack_fffffffffffffdc8 == pTVar4) goto LAB_01388776;
LAB_013887a8:
    TPZMatrix<std::complex<long_double>_>::Error
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else {
LAB_01388776:
    in_stack_fffffffffffffdc0 =
         (TPZFMatrix<std::complex<long_double>_> *)TPZBaseMatrix::Rows(in_RDI);
    pTVar4 = (TPZFMatrix<std::complex<long_double>_> *)
             TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
    if (in_stack_fffffffffffffdc0 != pTVar4) goto LAB_013887a8;
  }
  iVar5 = TPZBaseMatrix::Rows(local_20);
  iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
  if (iVar5 == iVar6) {
    iVar6 = TPZBaseMatrix::Cols(local_20);
    iVar7 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
    opt_00 = (int)((ulong)iVar5 >> 0x20);
    if (iVar6 != iVar7) goto LAB_0138881f;
  }
  else {
LAB_0138881f:
    pTVar3 = local_20;
    opt_00 = (int)((ulong)iVar5 >> 0x20);
    iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
    iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
    (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar3,iVar5,iVar6);
  }
  iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
  iVar6 = TPZBaseMatrix::Cols(local_18);
  if (iVar5 == iVar6) {
    iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
    iVar6 = TPZBaseMatrix::Cols(local_20);
    if (iVar5 == iVar6) {
      iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
      iVar6 = TPZBaseMatrix::Rows(local_18);
      if (iVar5 == iVar6) {
        iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
        iVar6 = TPZBaseMatrix::Rows(local_20);
        if (iVar5 == iVar6) goto LAB_01388a56;
      }
    }
  }
  in_stack_fffffffffffffd50 =
       (TPZFMatrix<std::complex<long_double>_> *)std::operator<<((ostream *)&std::cout,"x.Cols = ");
  iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
  poVar8 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd50,iVar5);
  poVar8 = std::operator<<(poVar8," y.Cols()");
  iVar5 = TPZBaseMatrix::Cols(local_18);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
  in_stack_fffffffffffffd60 = std::operator<<(poVar8," z.Cols() ");
  iVar5 = TPZBaseMatrix::Cols(local_20);
  poVar8 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd60,iVar5);
  poVar8 = std::operator<<(poVar8," x.Rows() ");
  iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_10);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
  poVar8 = std::operator<<(poVar8," y.Rows() ");
  iVar5 = TPZBaseMatrix::Rows(local_18);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
  poVar8 = std::operator<<(poVar8," z.Rows() ");
  iVar5 = TPZBaseMatrix::Rows(local_20);
  this_00 = (void *)std::ostream::operator<<(poVar8,iVar5);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  TPZMatrix<std::complex<long_double>_>::Error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
LAB_01388a56:
  local_48 = (this_01->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
  local_40 = (this_01->super_TPZBaseMatrix).fRow;
  column = (complex<long_double> *)(this_01->super_TPZBaseMatrix).fCol;
  uVar1._0_1_ = (this_01->super_TPZBaseMatrix).fDecomposed;
  uVar1._1_1_ = (this_01->super_TPZBaseMatrix).fDefPositive;
  uVar1._2_6_ = *(undefined6 *)&(this_01->super_TPZBaseMatrix).field_0x1a;
  uVar11 = (undefined6)((ulong)local_40 >> 0x10);
  uVar12 = (undefined2)uVar1;
  beta_00._M_value._8_24_ = in_stack_fffffffffffffde8;
  beta_00._M_value._0_8_ = in_RDI;
  local_38 = column;
  local_30 = uVar1;
  TPZMatrix<std::complex<long_double>_>::PrepareZ
            (this_01,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,beta_00,opt_00);
  local_50 = TPZBaseMatrix::Rows(in_RDI);
  local_58 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
  for (local_5c = 0; local_5c < local_58; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < local_50; local_60 = local_60 + 1) {
      local_68 = Size((TPZSkylMatrix<std::complex<long_double>_> *)CONCAT62(uVar1._2_6_,uVar12),
                      (int64_t)column);
      __r = (longdouble)0;
      __y = SUB108(__r,0);
      uVar10 = (undefined2)((unkuint10)__r >> 0x40);
      column = __y;
      uVar12 = uVar10;
      std::complex<long_double>::complex(&local_88,__r,__r);
      TPZFMatrix<std::complex<long_double>_>::g(local_10,(local_60 - local_68) + 1,(long)local_5c);
      ppcVar9 = TPZVec<std::complex<long_double>_*>::operator[]
                          ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),(long)local_60);
      local_98 = *ppcVar9 + local_68;
      ppcVar9 = TPZVec<std::complex<long_double>_*>::operator[]
                          ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),(long)local_60);
      pcVar2 = *ppcVar9;
      while (local_98 = local_98 + -1, pcVar2 < local_98) {
        if (local_24 == 0) {
          std::conj<long_double>((complex<long_double> *)in_stack_fffffffffffffd60);
          std::operator*((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
          std::complex<long_double>::operator+=((complex<long_double> *)CONCAT62(uVar11,uVar10),__y)
          ;
        }
        else {
          std::operator*((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
          std::complex<long_double>::operator+=((complex<long_double> *)CONCAT62(uVar11,uVar10),__y)
          ;
        }
      }
      if (local_98 == pcVar2) {
        std::operator*((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
        std::complex<long_double>::operator+=((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
      }
      std::operator*((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
      TPZFMatrix<std::complex<long_double>_>::operator()
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,CONCAT62(uVar1._2_6_,uVar12));
      std::complex<long_double>::operator+=((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
      local_150 = TPZFMatrix<std::complex<long_double>_>::operator()
                            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                             CONCAT62(uVar1._2_6_,uVar12));
      (*(local_10->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
        ._vptr_TPZSavable[0x24])(local_178,local_10,(long)local_60,(long)local_5c);
      local_88._M_value._0_8_ = local_178[0];
      local_88._M_value._8_8_ = local_178[1];
      local_88._M_value._16_8_ = local_178[2];
      local_88._M_value._24_8_ = local_178[3];
      ppcVar9 = TPZVec<std::complex<long_double>_*>::operator[]
                          ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),(long)local_60);
      local_98 = *ppcVar9 + local_68;
      while (local_98 = local_98 + -1, pcVar2 < local_98) {
        if (local_24 == 0) {
          std::operator*((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
          std::operator*((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
          std::complex<long_double>::operator+=((complex<long_double> *)CONCAT62(uVar11,uVar10),__y)
          ;
        }
        else {
          std::conj<long_double>((complex<long_double> *)in_stack_fffffffffffffd60);
          std::operator*((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
          std::operator*((complex<long_double> *)CONCAT62(uVar11,uVar10),__y);
          std::complex<long_double>::operator+=((complex<long_double> *)CONCAT62(uVar11,uVar10),__y)
          ;
        }
        local_150 = local_150 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}